

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O1

void zt_gc_collect(zt_gc_t *gc,int full_scan)

{
  uint uVar1;
  zt_gc_collectable_t *pzVar2;
  zt_elist *pzVar3;
  zt_elist *pzVar4;
  zt_elist *pzVar5;
  zt_elist_t *pzVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  zt_elist_t *elt;
  int iVar10;
  bool bVar11;
  zt_elist *local_28;
  
  uVar1 = gc->enabled;
  local_28 = (zt_elist *)(ulong)uVar1;
  if ((-1 < (int)uVar1) && ((full_scan != 0 || (gc->allocs_before_scan <= gc->current_allocs)))) {
    gc->enabled = uVar1 - 1;
    gc->current_allocs = 0;
    if (gc->scan == gc->grey) {
      gc->scan = gc->scan->next;
    }
    iVar10 = 0;
    do {
      pzVar2 = (zt_gc_collectable_t *)gc->scan;
      if (pzVar2 == (zt_gc_collectable_t *)gc->grey) {
        local_28 = gc->white->next;
        if (local_28 != gc->white) {
          do {
            pzVar3 = local_28->prev;
            pzVar4 = local_28->next;
            pzVar4->prev = pzVar3;
            pzVar3->next = pzVar4;
            (*gc->release_fn)(gc,gc->private_data,&local_28);
            local_28 = pzVar4;
          } while (pzVar4 != gc->white);
        }
        pzVar6 = gc->white;
        gc->white = gc->black;
        gc->black = pzVar6;
        bVar11 = gc->is_white != one_is_white;
        pcVar7 = zero_is_white;
        if (bVar11) {
          pcVar7 = one_is_white;
        }
        pcVar8 = one_clear_white;
        if (!bVar11) {
          pcVar8 = zero_clear_white;
        }
        pcVar9 = one_set_white;
        if (!bVar11) {
          pcVar9 = zero_set_white;
        }
        gc->is_white = pcVar7;
        gc->clear_white = pcVar8;
        gc->set_white = pcVar9;
        gc->enabled = gc->enabled + 1;
        return;
      }
      (*gc->clear_white)(pzVar2);
      (*gc->mark_fn)(gc,gc->private_data,pzVar2);
      pzVar3 = gc->scan->next;
      if ((pzVar2->colour & 2) == 0) {
        pzVar4 = (pzVar2->list).prev;
        pzVar5 = (pzVar2->list).next;
        pzVar5->prev = pzVar4;
        pzVar4->next = pzVar5;
        pzVar4 = gc->black;
        pzVar5 = pzVar4->next;
        pzVar5->prev = (zt_elist *)pzVar2;
        (pzVar2->list).next = pzVar5;
        (pzVar2->list).prev = pzVar4;
        pzVar4->next = (zt_elist *)pzVar2;
      }
      gc->scan = pzVar3;
      bVar11 = true;
      if (((full_scan == 0) && (iVar10 = iVar10 + 1, gc->marks_per_scan <= iVar10)) &&
         (pzVar3 != gc->grey)) {
        gc->enabled = gc->enabled + 1;
        bVar11 = false;
      }
    } while (bVar11);
  }
  return;
}

Assistant:

void
zt_gc_collect(zt_gc_t *gc, int full_scan)
{
    int current_marks = 0;

    if (gc->enabled < 0 ||
        (!full_scan && gc->current_allocs < gc->allocs_before_scan)) {
        return;
    }

    gc->enabled--;

#if DEBUG_SCAN
    printf("\n== Start Scan ==\n");
    zt_gc_print_heap(gc);
#endif /* DEBUG_SCAN */

    gc->current_allocs = 0;

    if (gc->scan == gc->grey) {
        /* beginning of a scan */
        gc->scan = gc->scan->next;
    }

    while (gc->scan != gc->grey) {
        /* move thru each object in the grey list moving it to the
         * black list and marking it as we go.
         */
        zt_elist_t          * next;
        zt_elist_t          * elt;
        zt_gc_collectable_t * mark;

        elt = gc->scan;

        mark = zt_elist_data(elt, zt_gc_collectable_t, list);

        gc->clear_white(mark);
        gc->mark_fn(gc, gc->private_data, elt);

        next = gc->scan->next;

        if (!is_protected(mark)) {
            /* if it is protected leave it in the grey list
             * otherwise move it to black
             */
            zt_elist_remove(elt);
            zt_elist_add(gc->black, elt);
        }

        gc->scan = next;

        if (!full_scan && ++current_marks >= gc->marks_per_scan) {
            if (gc->scan != gc->grey) {
                gc->enabled++;
#if DEBUG_SCAN
                printf("------\n");
                zt_gc_print_heap(gc);
                printf("== End Scan (Partial) ==\n\n");
#endif /* DEBUG_SCAN */
                return;
            }
        }
    }

    gc->enabled++;
#if DEBUG_SCAN
    printf("------\n");
    zt_gc_print_heap(gc);
    printf("== End Scan (Full) ==\n\n");
#endif /* DEBUG_SCAN */
    zt_gc_switch(gc);
}